

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m256v_basic.c
# Opt level: O2

_Bool test_copy(void)

{
  char *pcVar1;
  char *pcVar2;
  uint n_row;
  uint n_col;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint8_t *puVar6;
  size_t sVar7;
  ulong uVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  uint8_t auStack_80 [8];
  undefined1 local_78 [8];
  m256v B;
  m256v A;
  
  for (uVar5 = 0; uVar5 != 6; uVar5 = uVar5 + 1) {
    n_row = (&DAT_00104690)[uVar5];
    uVar13 = 0;
    if (0 < (int)n_row) {
      uVar13 = (ulong)n_row;
    }
    for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
      n_col = (&DAT_001046b0)[lVar4];
      uVar8 = (ulong)(n_col * n_row) + 0xf & 0xfffffffffffffff0;
      lVar3 = -uVar8;
      puVar6 = local_78 + lVar3;
      puVar9 = auStack_80 + lVar3;
      puVar9[0] = 0xbf;
      puVar9[1] = '\x1c';
      puVar9[2] = '\x10';
      puVar9[3] = '\0';
      puVar9[4] = '\0';
      puVar9[5] = '\0';
      puVar9[6] = '\0';
      puVar9[7] = '\0';
      rand_coeffs(puVar6,n_col * n_row,0xb0);
      puVar10 = auStack_80 + lVar3;
      puVar10[0] = 0xd1;
      puVar10[1] = '\x1c';
      puVar10[2] = '\x10';
      puVar10[3] = '\0';
      puVar10[4] = '\0';
      puVar10[5] = '\0';
      puVar10[6] = '\0';
      puVar10[7] = '\0';
      m256v_make((m256v *)&B.e,n_row,n_col,puVar6);
      puVar6 = puVar6 + -uVar8;
      puVar6[-8] = 0xec;
      puVar6[-7] = '\x1c';
      puVar6[-6] = '\x10';
      puVar6[-5] = '\0';
      puVar6[-4] = '\0';
      puVar6[-3] = '\0';
      puVar6[-2] = '\0';
      puVar6[-1] = '\0';
      m256v_make((m256v *)local_78,n_row,n_col,puVar6);
      puVar6[-8] = 0xf8;
      puVar6[-7] = '\x1c';
      puVar6[-6] = '\x10';
      puVar6[-5] = '\0';
      puVar6[-4] = '\0';
      puVar6[-3] = '\0';
      puVar6[-2] = '\0';
      puVar6[-1] = '\0';
      m256v_copy((m256v *)&B.e,(m256v *)local_78);
      if ((int)n_col < 1) {
        n_col = 0;
      }
      sVar7 = A.rstride;
      sVar11 = B.rstride;
      for (uVar8 = 0; uVar8 != uVar13; uVar8 = uVar8 + 1) {
        uVar12 = 0;
        while (n_col != uVar12) {
          pcVar1 = (char *)(sVar7 + uVar12);
          pcVar2 = (char *)(sVar11 + uVar12);
          uVar12 = uVar12 + 1;
          if (*pcVar1 != *pcVar2) goto LAB_00101d73;
        }
        sVar11 = sVar11 + B._0_8_;
        sVar7 = sVar7 + A._0_8_;
      }
    }
  }
LAB_00101d73:
  return 5 < uVar5;
}

Assistant:

static bool test_copy()
{
	const int nrow[] = { 1, 2, 3, 5, 9, 10 };
	const int ncol[] = { 1, 2, 3, 7, 8, 10 };
	for (int ir = 0; ir < array_size(nrow); ++ir) {
		const int nr = nrow[ir];
		for (int ic = 0; ic < array_size(ncol); ++ic) {
			const int nc = ncol[ic];

			Def_mat256_rand(A, a, nr, nc, 0xff)
			m256v_Def(B, b, nr, nc);
			m256v_copy(&A, &B);

			for (int r = 0; r < nr; ++r) {
				for (int c = 0; c < nc; ++c) {
					if (m256v_get_el(&A, r, c)
					   != m256v_get_el(&B, r, c))
					{
						return false;
					}
				}
			}
		}
	}

	return true;
}